

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QString,_QFileInfo>_>::reserve
          (QList<std::pair<QString,_QFileInfo>_> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *this_00;
  qsizetype qVar3;
  pair<QString,_QFileInfo> *e;
  pair<QString,_QFileInfo> *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_stack_ffffffffffffff80;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<std::pair<QString,_QFileInfo>_> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
            capacity((QList<std::pair<QString,_QFileInfo>_> *)0xa95ecf);
  qVar3 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::freeSpaceAtBegin
                    (in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<std::pair<QString,_QFileInfo>_>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00a96072;
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::setFlag
                ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa95f76,(ArrayOptions)f.i);
      goto LAB_00a96072;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (pair<QString,_QFileInfo> *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<std::pair<QString,_QFileInfo>_> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (pair<QString,_QFileInfo> *)
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(&local_38);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
  b = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
                ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa95ff6);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::end
            ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)e);
  QtPrivate::QGenericArrayOps<std::pair<QString,_QFileInfo>_>::copyAppend
            (in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
         QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::setFlag
              ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa96059,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::swap
            ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::~QArrayDataPointer
            ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)e);
LAB_00a96072:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}